

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Hex_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *this)

{
  Position *this_00;
  int *piVar1;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pcVar2 = (this->m_position).m_pos;
  if ((pcVar2 != (this->m_position).m_end) && (*pcVar2 == '0')) {
    this_00 = &this->m_position;
    Position::operator++(this_00);
    pbVar3 = (byte *)(this->m_position).m_pos;
    if ((pbVar3 != (byte *)(this->m_position).m_end) &&
       (m_alphabet._M_elems[4]._M_elems[*pbVar3] == true)) {
      Position::operator++(this_00);
      pbVar3 = (byte *)(this->m_position).m_pos;
      pbVar4 = (byte *)(this->m_position).m_end;
      if ((pbVar3 != pbVar4) && (m_alphabet._M_elems[5]._M_elems[*pbVar3] == true)) {
        do {
          if (m_alphabet._M_elems[5]._M_elems[*pbVar3] != true) {
            if (pbVar3 == pbVar4) {
              return true;
            }
            do {
              if (m_alphabet._M_elems[10]._M_elems[*pbVar3] != true) {
                return true;
              }
              Position::operator++(this_00);
              pbVar3 = (byte *)(this->m_position).m_pos;
            } while (pbVar3 != (byte *)(this->m_position).m_end);
            return true;
          }
          Position::operator++(this_00);
          pbVar3 = (byte *)(this->m_position).m_pos;
          pbVar4 = (byte *)(this->m_position).m_end;
        } while (pbVar3 != pbVar4);
        return true;
      }
    }
    (this->m_position).m_pos = (char *)(pbVar3 + -1);
    if (pbVar3[-1] == 10) {
      (this->m_position).line = (this->m_position).line + -1;
      (this->m_position).col = (this->m_position).m_last_col;
    }
    else {
      piVar1 = &(this->m_position).col;
      *piVar1 = *piVar1 + -1;
    }
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }